

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void __thiscall
kj::_::Delimited<kj::ArrayPtr<void_*const>_&>::~Delimited
          (Delimited<kj::ArrayPtr<void_*const>_&> *this)

{
  Delimited<kj::ArrayPtr<void_*const>_&> *this_local;
  
  Array<kj::CappedArray<char,_17UL>_>::~Array(&this->stringified);
  return;
}

Assistant:

Delimited(T array, kj::StringPtr delimiter)
      : array(kj::fwd<T>(array)), delimiter(delimiter) {}